

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O0

int lzo1x_1_compress(uchar *in,lzo_uint in_len,uchar *out,lzo_uint *out_len,void *wrkmem)

{
  byte bVar1;
  lzo_uint lVar2;
  uchar *local_50;
  lzo_uint tt;
  uchar *ii;
  lzo_uint t;
  uchar *op;
  void *wrkmem_local;
  lzo_uint *out_len_local;
  uchar *out_local;
  lzo_uint in_len_local;
  uchar *in_local;
  
  ii = (uchar *)in_len;
  t = (lzo_uint)out;
  if (0xd < in_len) {
    ii = (uchar *)_lzo1x_1_do_compress(in,in_len,out,out_len,wrkmem);
    t = (lzo_uint)(out + *out_len);
  }
  if (ii != (uchar *)0x0) {
    tt = (lzo_uint)(in + (in_len - (long)ii));
    bVar1 = (byte)ii;
    if (((uchar *)t == out) && (ii < (uchar *)0xef)) {
      *(byte *)t = bVar1 + 0x11;
      t = t + 1;
    }
    else if (ii < (uchar *)0x4) {
      *(byte *)(t - 2) = *(byte *)(t - 2) | bVar1;
    }
    else if (ii < (uchar *)0x13) {
      *(byte *)t = bVar1 - 3;
      t = t + 1;
    }
    else {
      local_50 = ii + -0x12;
      *(undefined1 *)t = 0;
      lVar2 = t;
      while (t = lVar2 + 1, (uchar *)0xff < local_50) {
        local_50 = local_50 + -0xff;
        *(undefined1 *)t = 0;
        lVar2 = t;
      }
      *(char *)t = (char)local_50;
      t = lVar2 + 2;
    }
    do {
      lVar2 = t + 1;
      *(undefined1 *)t = *(undefined1 *)tt;
      ii = ii + -1;
      tt = tt + 1;
      t = lVar2;
    } while (ii != (uchar *)0x0);
  }
  *(undefined1 *)t = 0x11;
  *(undefined1 *)(t + 1) = 0;
  *(undefined1 *)(t + 2) = 0;
  *out_len = (t + 3) - (long)out;
  return 0;
}

Assistant:

LZO_PUBLIC(int)
DO_COMPRESS      ( const lzo_bytep in , lzo_uint  in_len,
                         lzo_bytep out, lzo_uintp out_len,
                         lzo_voidp wrkmem )
{
    lzo_bytep op = out;
    lzo_uint t;

    if __lzo_unlikely(in_len <= M2_MAX_LEN + 5)
        t = in_len;
    else
    {
        t = do_compress(in,in_len,op,out_len,wrkmem);
        op += *out_len;
    }